

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

bool __thiscall CConsole::ExecuteFile(CConsole *this,char *pFilename)

{
  long lVar1;
  CExecFile *pCVar2;
  int iVar3;
  IOHANDLE IoHandle;
  char *pcVar4;
  long in_FS_OFFSET;
  bool bVar5;
  bool bVar6;
  char *in_stack_ffffffffffffee68;
  char *in_stack_ffffffffffffee70;
  CLineReader *in_stack_ffffffffffffee78;
  bool AbsHeur;
  char *pLine;
  IOHANDLE File;
  CExecFile *pPrev;
  CExecFile *pCur;
  char *pFilename_local;
  CConsole *this_local;
  bool local_1131;
  CExecFile ThisFile;
  CLineReader LineReader;
  char aBuf [256];
  undefined4 extraout_var;
  
  LineReader.m_aBuffer[0x120] = '\0';
  LineReader.m_aBuffer[0x121] = '\0';
  LineReader.m_aBuffer[0x122] = '\0';
  LineReader.m_aBuffer[0x123] = '\0';
  LineReader.m_aBuffer[0x124] = '\0';
  LineReader.m_aBuffer[0x125] = '\0';
  LineReader.m_aBuffer[0x126] = '\0';
  LineReader.m_aBuffer[0x127] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCur = this->m_pFirstExec;
  do {
    if (pCur == (CExecFile *)0x0) {
      if (this->m_pStorage == (IStorage *)0x0) {
        local_1131 = false;
      }
      else {
        pCVar2 = this->m_pFirstExec;
        ThisFile.m_pPrev = this->m_pFirstExec;
        this->m_pFirstExec = &ThisFile;
        ThisFile.m_pFilename = pFilename;
        iVar3 = (*(this->m_pStorage->super_IInterface)._vptr_IInterface[4])
                          (this->m_pStorage,pFilename,9,0xffffffff,0,0,0,0);
        IoHandle = (IOHANDLE)CONCAT44(extraout_var,iVar3);
        if (IoHandle == (IOHANDLE)0x0) {
          str_format(aBuf,0x100,"failed to open \'%s\'",pFilename);
          (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x19])(this,0,"console",aBuf);
          bVar5 = true;
          if (*pFilename != '/') {
            bVar5 = *pFilename == '\\';
          }
          bVar6 = true;
          if ((((!bVar5) && (bVar6 = false, *pFilename != '\0')) &&
              (bVar6 = false, pFilename[1] == ':')) && (bVar6 = true, pFilename[2] != '/')) {
            bVar6 = pFilename[2] == '\\';
          }
          if (bVar6) {
            (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x19])
                      (this,0,"console",
                       "Info: only relative paths starting from the ones you specify in \'storage.cfg\' are allowed"
                      );
          }
        }
        else {
          str_format(aBuf,0x100,"executing \'%s\'",pFilename);
          (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x19])(this,0,"console",aBuf);
          CLineReader::Init(&LineReader,IoHandle);
          while (pcVar4 = CLineReader::Get(in_stack_ffffffffffffee78), pcVar4 != (char *)0x0) {
            (*(this->super_IConsole).super_IInterface._vptr_IInterface[0x13])(this,pcVar4);
          }
          io_close((IOHANDLE)0x22b91a);
        }
        this->m_pFirstExec = pCVar2;
        local_1131 = IoHandle != (IOHANDLE)0x0;
      }
LAB_0022ba65:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_1131;
      }
      __stack_chk_fail();
    }
    iVar3 = str_comp(in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
    if (iVar3 == 0) {
      local_1131 = false;
      goto LAB_0022ba65;
    }
    pCur = pCur->m_pPrev;
  } while( true );
}

Assistant:

bool CConsole::ExecuteFile(const char *pFilename)
{
	// make sure that this isn't being executed already
	for(CExecFile *pCur = m_pFirstExec; pCur; pCur = pCur->m_pPrev)
		if(str_comp(pFilename, pCur->m_pFilename) == 0)
			return false;

	if(!m_pStorage)
		return false;

	// push this one to the stack
	CExecFile ThisFile;
	CExecFile *pPrev = m_pFirstExec;
	ThisFile.m_pFilename = pFilename;
	ThisFile.m_pPrev = m_pFirstExec;
	m_pFirstExec = &ThisFile;

	// exec the file
	IOHANDLE File = m_pStorage->OpenFile(pFilename, IOFLAG_READ | IOFLAG_SKIP_BOM, IStorage::TYPE_ALL);

	char aBuf[256];
	if(File)
	{
		str_format(aBuf, sizeof(aBuf), "executing '%s'", pFilename);
		Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", aBuf);

		CLineReader LineReader;
		LineReader.Init(File);
		const char *pLine;
		while((pLine = LineReader.Get()))
			ExecuteLine(pLine);

		io_close(File);
	}
	else
	{
		str_format(aBuf, sizeof(aBuf), "failed to open '%s'", pFilename);
		Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", aBuf);
		bool AbsHeur = false;
		AbsHeur = AbsHeur || (pFilename[0] == '/' || pFilename[0] == '\\');
		AbsHeur = AbsHeur || (pFilename[0] && pFilename[1] == ':' && (pFilename[2] == '/' || pFilename[2] == '\\'));
		if(AbsHeur)
		{
			Print(IConsole::OUTPUT_LEVEL_STANDARD, "console", "Info: only relative paths starting from the ones you specify in 'storage.cfg' are allowed");
		}
	}

	m_pFirstExec = pPrev;
	return (bool)File;
}